

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzbasematrix.h
# Opt level: O2

void __thiscall
TPZBlockDiagonal<float>::BuildFromMatrix(TPZBlockDiagonal<float> *this,TPZMatrix<float> *mat)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  undefined4 extraout_XMM0_Da;
  long local_78;
  
  if ((mat->super_TPZBaseMatrix).fRow == (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow) {
    lVar2 = (this->fBlockSize).fNElements;
    local_78 = 0;
    if (lVar2 < 1) {
      lVar2 = 0;
    }
    for (lVar4 = 0; lVar4 != lVar2; lVar4 = lVar4 + 1) {
      uVar1 = (this->fBlockSize).fStore[lVar4];
      uVar5 = 0;
      if (0 < (int)uVar1) {
        uVar5 = (ulong)uVar1;
      }
      lVar7 = (this->fBlockPos).fStore[lVar4] << 2;
      for (uVar3 = 0; uVar3 != uVar5; uVar3 = uVar3 + 1) {
        lVar6 = local_78;
        lVar8 = lVar7;
        uVar9 = (ulong)uVar1;
        while (bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
          (*(mat->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (mat,local_78 + uVar3,lVar6);
          *(undefined4 *)((long)(this->fStorage).fStore + lVar8) = extraout_XMM0_Da;
          lVar6 = lVar6 + 1;
          lVar8 = lVar8 + (long)(int)uVar1 * 4;
        }
        lVar7 = lVar7 + 4;
      }
      local_78 = local_78 + (int)uVar1;
    }
    return;
  }
  std::operator<<((ostream *)&std::cout,"TPZBlockDiagonal::BuildFromMatrix wrong data structure\n");
  return;
}

Assistant:

inline int64_t Rows() const { return fRow; }